

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  cmLocalNinjaGenerator *pcVar1;
  bool bVar2;
  char *pcVar3;
  allocator local_41;
  string local_40;
  
  cmCommonTargetGenerator::GetFlags
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language);
  bVar2 = std::operator==(language,"Fortran");
  if (bVar2) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
  }
  pcVar1 = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_40,"COMPILE_FLAGS",&local_41);
  pcVar3 = cmSourceFile::GetProperty(source,&local_40);
  (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
            (pcVar1,__return_storage_ptr__,pcVar3);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmNinjaTargetGenerator::ComputeFlagsForObject(cmSourceFile const* source,
                                              const std::string& language)
{
  std::string flags = this->GetFlags(language);

  // Add Fortran format flags.
  if(language == "Fortran")
    {
    this->AppendFortranFormatFlags(flags, *source);
    }

  // Add source file specific flags.
  this->LocalGenerator->AppendFlags(flags,
    source->GetProperty("COMPILE_FLAGS"));

  return flags;
}